

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O1

mz_bool mz_zip_file_stat_internal
                  (mz_zip_archive *pZip,mz_uint file_index,mz_uint8 *pCentral_dir_header,
                  mz_zip_archive_file_stat *pStat,mz_bool *pFound_zip64_extra_data)

{
  ushort uVar1;
  ushort uVar2;
  mz_zip_internal_state *pmVar3;
  bool bVar4;
  uint uVar5;
  time_t tVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  mz_zip_error mVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  mz_uint64 *pmVar15;
  short *psVar16;
  tm local_68;
  
  if (pFound_zip64_extra_data != (mz_bool *)0x0) {
    *pFound_zip64_extra_data = 0;
  }
  if (pCentral_dir_header == (mz_uint8 *)0x0 || pStat == (mz_zip_archive_file_stat *)0x0) {
    if (pZip == (mz_zip_archive *)0x0) {
      return 0;
    }
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  pStat->m_file_index = file_index;
  uVar10 = (ulong)file_index;
  if ((pZip->m_pState->m_central_dir_offsets).m_size <= uVar10) goto LAB_0013c67e;
  pStat->m_central_dir_ofs =
       (ulong)*(uint *)((long)(pZip->m_pState->m_central_dir_offsets).m_p + uVar10 * 4);
  pStat->m_version_made_by = *(mz_uint16 *)(pCentral_dir_header + 4);
  pStat->m_version_needed = *(mz_uint16 *)(pCentral_dir_header + 6);
  pStat->m_bit_flag = *(mz_uint16 *)(pCentral_dir_header + 8);
  pStat->m_method = *(mz_uint16 *)(pCentral_dir_header + 10);
  uVar1 = *(ushort *)(pCentral_dir_header + 0xc);
  uVar2 = *(ushort *)(pCentral_dir_header + 0xe);
  local_68.tm_gmtoff = 0;
  local_68.tm_zone = (char *)0x0;
  local_68.tm_wday = 0;
  local_68.tm_yday = 0;
  local_68.tm_isdst = -1;
  local_68._36_4_ = 0;
  local_68.tm_year = (uVar2 >> 9) + 0x50;
  local_68.tm_mon = (uVar2 >> 5 & 0xf) - 1;
  local_68._8_8_ = (ulong)CONCAT24(uVar2,(uint)(uVar1 >> 0xb)) & 0x1fffffffff;
  local_68._0_8_ = (ulong)CONCAT24(uVar1 >> 5,(uint)uVar1 * 2) & 0x3f0000003e;
  tVar6 = mktime(&local_68);
  pStat->m_time = tVar6;
  pStat->m_crc32 = *(mz_uint32 *)(pCentral_dir_header + 0x10);
  uVar7 = (ulong)*(uint *)(pCentral_dir_header + 0x14);
  pStat->m_comp_size = uVar7;
  uVar8 = (ulong)*(uint *)(pCentral_dir_header + 0x18);
  pStat->m_uncomp_size = uVar8;
  pStat->m_internal_attr = *(mz_uint16 *)(pCentral_dir_header + 0x24);
  pStat->m_external_attr = *(mz_uint32 *)(pCentral_dir_header + 0x26);
  uVar14 = *(uint *)(pCentral_dir_header + 0x2a);
  pStat->m_local_header_ofs = (ulong)uVar14;
  uVar5 = (uint)*(ushort *)(pCentral_dir_header + 0x1c);
  if (0x1fe < *(ushort *)(pCentral_dir_header + 0x1c)) {
    uVar5 = 0x1ff;
  }
  memcpy(pStat->m_filename,pCentral_dir_header + 0x2e,(ulong)uVar5);
  pStat->m_filename[uVar5] = '\0';
  uVar5 = 0x1ff;
  if (*(ushort *)(pCentral_dir_header + 0x20) < 0x1ff) {
    uVar5 = (uint)*(ushort *)(pCentral_dir_header + 0x20);
  }
  pStat->m_comment_size = uVar5;
  memcpy(pStat->m_comment,
         pCentral_dir_header +
         (ulong)*(ushort *)(pCentral_dir_header + 0x1e) +
         (ulong)*(ushort *)(pCentral_dir_header + 0x1c) + 0x2e,(ulong)uVar5);
  pStat->m_comment[uVar5] = '\0';
  if ((pZip == (mz_zip_archive *)0x0) ||
     (pmVar3 = pZip->m_pState, pmVar3 == (mz_zip_internal_state *)0x0)) {
    lVar13 = 0;
  }
  else if (file_index < pZip->m_total_files) {
    if (((pmVar3->m_central_dir_offsets).m_size <= uVar10) ||
       (uVar9 = (ulong)*(uint *)((long)(pmVar3->m_central_dir_offsets).m_p + uVar10 * 4),
       (pmVar3->m_central_dir).m_size <= uVar9)) goto LAB_0013c67e;
    lVar13 = uVar9 + (long)(pmVar3->m_central_dir).m_p;
  }
  else {
    lVar13 = 0;
  }
  if (lVar13 == 0) {
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
      uVar5 = 0;
      goto LAB_0013c440;
    }
    pStat->m_is_directory = 0;
LAB_0013c48e:
    lVar13 = 0;
  }
  else {
    if (((ulong)*(ushort *)(lVar13 + 0x1c) == 0) ||
       (uVar5 = 1, *(char *)(lVar13 + 0x2d + (ulong)*(ushort *)(lVar13 + 0x1c)) != '/')) {
      uVar5 = *(uint *)(lVar13 + 0x26) >> 4 & 1;
    }
LAB_0013c440:
    pStat->m_is_directory = uVar5;
    if (pZip == (mz_zip_archive *)0x0) goto LAB_0013c48e;
    pmVar3 = pZip->m_pState;
    if ((pmVar3 == (mz_zip_internal_state *)0x0) || (pZip->m_total_files <= file_index)) {
      lVar13 = 0;
    }
    else {
      if (((pmVar3->m_central_dir_offsets).m_size <= uVar10) ||
         (uVar9 = (ulong)*(uint *)((long)(pmVar3->m_central_dir_offsets).m_p + uVar10 * 4),
         (pmVar3->m_central_dir).m_size <= uVar9)) goto LAB_0013c67e;
      lVar13 = uVar9 + (long)(pmVar3->m_central_dir).m_p;
    }
  }
  if (lVar13 == 0) {
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
      uVar5 = 0;
      goto LAB_0013c4b9;
    }
    pStat->m_is_encrypted = 0;
LAB_0013c4f9:
    lVar13 = 0;
  }
  else {
    uVar5 = (uint)((*(byte *)(lVar13 + 8) & 0x41) != 0);
LAB_0013c4b9:
    pStat->m_is_encrypted = uVar5;
    if (((pZip == (mz_zip_archive *)0x0) ||
        (pmVar3 = pZip->m_pState, pmVar3 == (mz_zip_internal_state *)0x0)) ||
       (pZip->m_total_files <= file_index)) goto LAB_0013c4f9;
    if (((pmVar3->m_central_dir_offsets).m_size <= uVar10) ||
       (uVar10 = (ulong)*(uint *)((long)(pmVar3->m_central_dir_offsets).m_p + uVar10 * 4),
       (pmVar3->m_central_dir).m_size <= uVar10)) {
LAB_0013c67e:
      __assert_fail("index < pArray->m_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/cpp/src/../../Zippy/library/Zippy/miniz/miniz.h"
                    ,0x129b,"mz_uint mz_zip_array_range_check(const mz_zip_array *, mz_uint)");
    }
    lVar13 = uVar10 + (long)(pmVar3->m_central_dir).m_p;
  }
  if (lVar13 == 0) {
    mVar11 = MZ_ZIP_INVALID_PARAMETER;
LAB_0013c52c:
    if (pZip != (mz_zip_archive *)0x0) goto LAB_0013c531;
  }
  else {
    if ((*(ushort *)(lVar13 + 10) & 0xfff7) != 0) {
      mVar11 = MZ_ZIP_UNSUPPORTED_METHOD;
      goto LAB_0013c52c;
    }
    uVar1 = *(ushort *)(lVar13 + 8);
    if ((uVar1 & 0x41) != 0) {
      mVar11 = MZ_ZIP_UNSUPPORTED_ENCRYPTION;
      goto LAB_0013c52c;
    }
    uVar5 = (uVar1 & 0x20) >> 5 ^ 1;
    if ((pZip == (mz_zip_archive *)0x0) ||
       (mVar11 = MZ_ZIP_UNSUPPORTED_FEATURE, (uVar1 & 0x20) == 0)) goto LAB_0013c537;
LAB_0013c531:
    pZip->m_last_error = mVar11;
  }
  uVar5 = 0;
LAB_0013c537:
  pStat->m_is_supported = uVar5;
  if (uVar8 < uVar7) {
    uVar8 = uVar7;
  }
  uVar5 = (uint)uVar8;
  if (uVar8 <= uVar14) {
    uVar5 = uVar14;
  }
  if ((uVar5 == 0xffffffff) &&
     (uVar14 = (uint)*(ushort *)(pCentral_dir_header + 0x1e),
     *(ushort *)(pCentral_dir_header + 0x1e) != 0)) {
    psVar16 = (short *)(pCentral_dir_header + 0x2e + *(ushort *)(pCentral_dir_header + 0x1c));
    do {
      if (uVar14 < 4) {
LAB_0013c595:
        iVar12 = 1;
        if (pZip != (mz_zip_archive *)0x0) {
          pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
        }
LAB_0013c5a7:
        bVar4 = false;
      }
      else {
        uVar1 = psVar16[1];
        uVar5 = (uint)uVar1;
        if ((ulong)uVar14 < (ulong)uVar1 + 4) goto LAB_0013c595;
        if (*psVar16 == 1) {
          if (pFound_zip64_extra_data != (mz_bool *)0x0) {
            *pFound_zip64_extra_data = 1;
          }
          if (pStat->m_uncomp_size == 0xffffffff) {
            if (uVar1 < 8) goto LAB_0013c595;
            pStat->m_uncomp_size = *(mz_uint64 *)(psVar16 + 2);
            pmVar15 = (mz_uint64 *)(psVar16 + 6);
            uVar5 = uVar1 - 8;
          }
          else {
            pmVar15 = (mz_uint64 *)(psVar16 + 2);
          }
          if (pStat->m_comp_size == 0xffffffff) {
            if (uVar5 < 8) goto LAB_0013c595;
            pStat->m_comp_size = *pmVar15;
            pmVar15 = pmVar15 + 1;
            uVar5 = uVar5 - 8;
          }
          iVar12 = 2;
          if (pStat->m_local_header_ofs == 0xffffffff) {
            if (uVar5 < 8) goto LAB_0013c595;
            pStat->m_local_header_ofs = *pmVar15;
          }
          goto LAB_0013c5a7;
        }
        psVar16 = (short *)((long)psVar16 + (ulong)uVar1 + 4);
        uVar14 = (uVar14 - uVar1) - 4;
        iVar12 = 0;
        bVar4 = true;
      }
      if (iVar12 != 0) {
        if (iVar12 == 2) {
          return 1;
        }
        if (bVar4) {
          return 1;
        }
        return 0;
      }
    } while (uVar14 != 0);
  }
  return 1;
}

Assistant:

static mz_bool mz_zip_file_stat_internal(mz_zip_archive* pZip,
                                         mz_uint file_index,
                                         const mz_uint8* pCentral_dir_header,
                                         mz_zip_archive_file_stat* pStat,
                                         mz_bool* pFound_zip64_extra_data) {

    mz_uint n;
    const mz_uint8* p = pCentral_dir_header;

    if (pFound_zip64_extra_data)
        *pFound_zip64_extra_data = MZ_FALSE;

    if ((!p) || (!pStat))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    /* Extract fields from the central directory record. */
    pStat->m_file_index = file_index;
    pStat->m_central_dir_ofs = MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets, mz_uint32, file_index);
    pStat->m_version_made_by = MZ_READ_LE16(p + MZ_ZIP_CDH_VERSION_MADE_BY_OFS);
    pStat->m_version_needed = MZ_READ_LE16(p + MZ_ZIP_CDH_VERSION_NEEDED_OFS);
    pStat->m_bit_flag = MZ_READ_LE16(p + MZ_ZIP_CDH_BIT_FLAG_OFS);
    pStat->m_method = MZ_READ_LE16(p + MZ_ZIP_CDH_METHOD_OFS);
#ifndef MINIZ_NO_TIME
    pStat->m_time = mz_zip_dos_to_time_t(MZ_READ_LE16(p + MZ_ZIP_CDH_FILE_TIME_OFS),
                                         MZ_READ_LE16(p + MZ_ZIP_CDH_FILE_DATE_OFS));
#endif
    pStat->m_crc32 = MZ_READ_LE32(p + MZ_ZIP_CDH_CRC32_OFS);
    pStat->m_comp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS);
    pStat->m_uncomp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS);
    pStat->m_internal_attr = MZ_READ_LE16(p + MZ_ZIP_CDH_INTERNAL_ATTR_OFS);
    pStat->m_external_attr = MZ_READ_LE32(p + MZ_ZIP_CDH_EXTERNAL_ATTR_OFS);
    pStat->m_local_header_ofs = MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS);

    /* Copy as much of the filename and comment as possible. */
    n = MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS);
    n = MZ_MIN(n, MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE - 1);
    memcpy(pStat->m_filename, p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE, n);
    pStat->m_filename[n] = '\0';

    n = MZ_READ_LE16(p + MZ_ZIP_CDH_COMMENT_LEN_OFS);
    n = MZ_MIN(n, MZ_ZIP_MAX_ARCHIVE_FILE_COMMENT_SIZE - 1);
    pStat->m_comment_size = n;
    memcpy(pStat->m_comment,
           p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS)
                   + MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS),
           n);
    pStat->m_comment[n] = '\0';

    /* Set some flags for convienance */
    pStat->m_is_directory = mz_zip_reader_is_file_a_directory(pZip, file_index);
    pStat->m_is_encrypted = mz_zip_reader_is_file_encrypted(pZip, file_index);
    pStat->m_is_supported = mz_zip_reader_is_file_supported(pZip, file_index);

    /* See if we need to read any zip64 extended information fields. */
    /* Confusingly, these zip64 fields can be present even on non-zip64 archives (Debian zip on a huge files from stdin piped to stdout creates them). */
    if (MZ_MAX(MZ_MAX(pStat->m_comp_size, pStat->m_uncomp_size), pStat->m_local_header_ofs) == MZ_UINT32_MAX) {
        /* Attempt to find zip64 extended information field in the entry's extra data */
        mz_uint32 extra_size_remaining = MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS);

        if (extra_size_remaining) {
            const mz_uint8* pExtra_data =
                                  p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS);

            do {
                mz_uint32 field_id;
                mz_uint32 field_data_size;

                if (extra_size_remaining < (sizeof(mz_uint16) * 2))
                    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

                field_id = MZ_READ_LE16(pExtra_data);
                field_data_size = MZ_READ_LE16(pExtra_data + sizeof(mz_uint16));

                if ((field_data_size + sizeof(mz_uint16) * 2) > extra_size_remaining)
                    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

                if (field_id == MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID) {
                    const mz_uint8* pField_data = pExtra_data + sizeof(mz_uint16) * 2;
                    mz_uint32 field_data_remaining = field_data_size;

                    if (pFound_zip64_extra_data)
                        *pFound_zip64_extra_data = MZ_TRUE;

                    if (pStat->m_uncomp_size == MZ_UINT32_MAX) {
                        if (field_data_remaining < sizeof(mz_uint64))
                            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

                        pStat->m_uncomp_size = MZ_READ_LE64(pField_data);
                        pField_data += sizeof(mz_uint64);
                        field_data_remaining -= sizeof(mz_uint64);
                    }

                    if (pStat->m_comp_size == MZ_UINT32_MAX) {
                        if (field_data_remaining < sizeof(mz_uint64))
                            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

                        pStat->m_comp_size = MZ_READ_LE64(pField_data);
                        pField_data += sizeof(mz_uint64);
                        field_data_remaining -= sizeof(mz_uint64);
                    }

                    if (pStat->m_local_header_ofs == MZ_UINT32_MAX) {
                        if (field_data_remaining < sizeof(mz_uint64))
                            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

                        pStat->m_local_header_ofs = MZ_READ_LE64(pField_data);
                        pField_data += sizeof(mz_uint64);
                        field_data_remaining -= sizeof(mz_uint64);
                    }

                    break;
                }

                pExtra_data += sizeof(mz_uint16) * 2 + field_data_size;
                extra_size_remaining = extra_size_remaining - sizeof(mz_uint16) * 2 - field_data_size;
            } while (extra_size_remaining);
        }
    }

    return MZ_TRUE;
}